

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.h
# Opt level: O1

void __thiscall S2Builder::Graph::VertexOutMap::VertexOutMap(VertexOutMap *this,Graph *g)

{
  (this->edge_begins_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->edge_begins_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->edge_begins_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  Init(this,g);
  return;
}

Assistant:

explicit VertexOutMap(const Graph& g) { Init(g); }